

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

string * cfd::core::ToBase58String
                   (string *__return_storage_ptr__,ByteData *serialize_data,string *caller_name)

{
  int iVar1;
  size_t sVar2;
  string *psVar3;
  CfdException *pCVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *wally_string;
  int ret;
  char *output;
  size_t local_58;
  WallyUtil *local_50;
  undefined1 local_48 [32];
  
  local_50 = (WallyUtil *)0x0;
  sVar2 = ByteData::GetDataSize(serialize_data);
  if (sVar2 != 0x4e) {
    local_48._0_8_ = "cfdcore_hdwallet.cpp";
    local_48._8_4_ = 0x8b;
    local_48._16_8_ = "ToBase58String";
    local_58 = ByteData::GetDataSize(serialize_data);
    logger::log<std::__cxx11::string_const&,unsigned_long&>
              ((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
               "{} serialize_data size illegal. size={}",caller_name,&local_58);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     caller_name," serialize_data size error.");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_48);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                     serialize_data);
  iVar1 = wally_base58_from_bytes((uchar *)local_48._0_8_,0x4e,1,(char **)&local_50);
  wally_string = extraout_RDX;
  if ((uchar *)local_48._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_48._0_8_);
    wally_string = extraout_RDX_00;
  }
  local_58 = CONCAT44(local_58._4_4_,iVar1);
  if (iVar1 == 0) {
    psVar3 = WallyUtil::ConvertStringAndFree_abi_cxx11_
                       (__return_storage_ptr__,local_50,wally_string);
    return psVar3;
  }
  local_48._0_8_ = "cfdcore_hdwallet.cpp";
  local_48._8_4_ = 0x96;
  local_48._16_8_ = "ToBase58String";
  logger::log<std::__cxx11::string_const&,int&>
            ((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
             "{}, wally_base58_from_bytes error. ret={}",caller_name,(int *)&local_58);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   caller_name," base58 encode error.");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static std::string ToBase58String(
    const ByteData& serialize_data, const std::string& caller_name) {
  char* output = nullptr;
  if (serialize_data.GetDataSize() != BIP32_SERIALIZED_LEN) {
    warn(
        CFD_LOG_SOURCE, "{} serialize_data size illegal. size={}", caller_name,
        serialize_data.GetDataSize());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        caller_name + " serialize_data size error.");
  }
  int ret = wally_base58_from_bytes(
      serialize_data.GetBytes().data(), BIP32_SERIALIZED_LEN,
      BASE58_FLAG_CHECKSUM, &output);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "{}, wally_base58_from_bytes error. ret={}",
        caller_name, ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " base58 encode error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}